

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::push_clip
          (Fl_PostScript_Graphics_Driver *this,int x,int y,int w,int h)

{
  Clip *__s;
  Clip *c;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  __s = (Clip *)operator_new(0x18);
  memset(__s,0,0x18);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2b])
            (this,(ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)h,__s,&__s->y,&__s->w,
             &__s->h);
  __s->prev = this->clip_;
  this->clip_ = __s;
  fprintf((FILE *)this->output,"CR\nCS\n");
  if (this->lang_level_ < 3) {
    recover(this);
  }
  clocale_printf(this,"%g %g %i %i CL\n",(double)this->clip_->x - 0.5,(double)this->clip_->y - 0.5,
                 (ulong)(uint)this->clip_->w,(ulong)(uint)this->clip_->h);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::push_clip(int x, int y, int w, int h) {
  Clip * c=new Clip();
  clip_box(x,y,w,h,c->x,c->y,c->w,c->h);
  c->prev=clip_;
  clip_=c;
  fprintf(output, "CR\nCS\n");
  if(lang_level_<3)
    recover();
  clocale_printf("%g %g %i %i CL\n", clip_->x-0.5 , clip_->y-0.5 , clip_->w  , clip_->h);
  
}